

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O3

void __thiscall UnifiedRegex::AltNode::AnnotatePass4(AltNode *this,Compiler *compiler)

{
  undefined1 *puVar1;
  AltNode **ppAVar2;
  CharCount CVar3;
  Node *pNVar4;
  CharSetNode *pCVar5;
  code *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  CharSet<char16_t> *pCVar15;
  undefined4 *puVar16;
  RuntimeCharTrie *this_00;
  CompilationScheme CVar17;
  AltNode *pAVar18;
  AltNode *curr;
  int iVar19;
  byte bVar20;
  AltNode *curr_3;
  AltNode *pAVar21;
  uint uVar22;
  bool bVar23;
  undefined1 local_90 [8];
  CharSet<char16_t> unionSet;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  uVar22 = *(uint *)&(this->super_Node).field_0xc;
  pAVar18 = this;
  if ((~uVar22 & 6) == 0) {
LAB_00e9a3bf:
    pAVar21 = pAVar18->tail;
    if ((pAVar18->head->field_0xc & 2) == 0) goto code_r0x00e9a3cd;
    if (pAVar21 != (AltNode *)0x0) {
      pAVar18->tail = (AltNode *)0x0;
      if (((this->super_Node).field_0xc & 1) != 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar16 = 1;
        bVar10 = Js::Throw::ReportAssert
                           ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                            ,0x8e9,"(!isFirstExact)","!isFirstExact");
        if (!bVar10) goto LAB_00e9adf3;
        *puVar16 = 0;
      }
      pCVar15 = (CharSet<char16_t> *)
                new<Memory::ArenaAllocator>(0x28,compiler->ctAllocator,0x364470);
      CharSet<char16_t>::CharSet(pCVar15);
      (this->super_Node).firstSet = pCVar15;
      pAVar18 = this;
      do {
        CharSet<char16_t>::UnionInPlace
                  ((this->super_Node).firstSet,compiler->ctAllocator,pAVar18->head->firstSet);
        pAVar18 = pAVar18->tail;
      } while (pAVar18 != (AltNode *)0x0);
      uVar22 = *(uint *)&(this->super_Node).field_0xc;
    }
  }
LAB_00e9a494:
  *(uint *)&(this->super_Node).field_0xc = uVar22 | 0x200;
  pAVar18 = this;
  do {
    (*pAVar18->head->_vptr_Node[10])(pAVar18->head,compiler);
    if ((pAVar18->head->field_0xd & 2) == 0) {
      puVar1 = &(this->super_Node).field_0xd;
      *puVar1 = *puVar1 & 0xfd;
    }
    pAVar18 = pAVar18->tail;
  } while (pAVar18 != (AltNode *)0x0);
  bVar10 = true;
  uVar22 = 0;
  unionSet.rep._32_8_ = compiler;
  puVar16 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  iVar19 = 0;
  bVar20 = 1;
  pAVar18 = this;
  do {
    pNVar4 = pAVar18->head;
    CVar3 = (pNVar4->thisConsumes).lower;
    if (CVar3 == 0) goto LAB_00e9a75e;
    pCVar15 = pNVar4->firstSet;
    pCVar5 = (pCVar15->rep).full.root;
    puVar1 = (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7);
    if ((((pNVar4->features & 0x110e) == 0) && ((*(uint *)&pNVar4->field_0xc & 2) == 0)) &&
       ((*(uint *)&pNVar4->field_0xc & 1) != 0)) {
      bVar10 = (bool)(((pNVar4->thisConsumes).upper == 1 && CVar3 == 1) & bVar10);
    }
    else {
      bVar10 = false;
    }
    if (&DAT_00000004 < puVar1) {
      if (pCVar5 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
      }
      else {
        if ((pCVar5 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00e9adf3;
          *puVar16 = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
        pCVar5 = (pCVar15->rep).full.root;
        if (pCVar5 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar5->_vptr_CharSetNode[0xb])();
        }
        uVar11 = iVar14 + uVar11;
      }
    }
    else {
      uVar11 = (int)pCVar5 - 1;
    }
    uVar22 = uVar22 + uVar11;
    bVar20 = bVar20 & puVar1 < &DAT_00000005;
    pAVar18 = pAVar18->tail;
    iVar19 = iVar19 + 1;
  } while (pAVar18 != (AltNode *)0x0);
  if (iVar19 < 2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar16 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0x925,"(numItems > 1)","numItems > 1");
    if (!bVar8) goto LAB_00e9adf3;
    *puVar16 = 0;
  }
  pCVar15 = (this->super_Node).firstSet;
  pCVar5 = (pCVar15->rep).full.root;
  if (&DAT_00000004 < (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7)) {
    if (pCVar5 == (CharSetNode *)0x0) {
      uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
    }
    else {
      if ((pCVar5 != (CharSetNode *)&CharSetFull::Instance) &&
         (uVar13 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5), 0xff00 < uVar13)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar16 = 1;
        bVar8 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                           ,0x252,
                           "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                           ,
                           "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                          );
        if (!bVar8) goto LAB_00e9adf3;
        *puVar16 = 0;
      }
      uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
      pCVar5 = (pCVar15->rep).full.root;
      if (pCVar5 == (CharSetNode *)&CharSetFull::Instance) {
        iVar19 = 0xff00;
      }
      else {
        iVar19 = (*pCVar5->_vptr_CharSetNode[0xb])();
      }
      uVar11 = iVar19 + uVar11;
    }
  }
  else {
    uVar11 = (int)pCVar5 - 1;
  }
  if (uVar22 == uVar11) {
    if (bVar10) {
      this->scheme = Set;
    }
    else if ((bool)(bVar20 & uVar22 < 0x19)) {
      this->scheme = Switch;
      this->switchSize = uVar22;
    }
    else {
      this->scheme = Chain;
    }
    this->isOptional = false;
    return;
  }
LAB_00e9a75e:
  bVar20 = 1;
  uVar22 = 0;
  iVar19 = 0;
  bVar10 = true;
  bVar8 = false;
  pAVar18 = this;
  do {
    while (pNVar4 = pAVar18->head, pAVar21 = this, (pNVar4->features & 0x110e) != 0) {
      if ((pNVar4->thisConsumes).lower == 0) goto LAB_00e9ac7e;
LAB_00e9a7e0:
      bVar10 = false;
LAB_00e9a7e2:
      pCVar15 = pNVar4->firstSet;
      pCVar5 = (pCVar15->rep).full.root;
      bVar23 = (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7) < &DAT_00000005;
      if (bVar23) {
        uVar11 = (int)pCVar5 - 1;
      }
      else if (pCVar5 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
      }
      else {
        if ((pCVar5 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar9) goto LAB_00e9adf3;
          *puVar16 = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
        pCVar5 = (pCVar15->rep).full.root;
        if (pCVar5 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2);
        }
        uVar11 = iVar14 + uVar11;
      }
      iVar19 = iVar19 + 1;
      bVar20 = bVar23 & bVar20;
      uVar22 = uVar11 + uVar22;
      pAVar18 = pAVar18->tail;
      if (pAVar18 == (AltNode *)0x0) {
        if (!bVar8) goto LAB_00e9ac7e;
        goto LAB_00e9a904;
      }
    }
    CVar3 = (pNVar4->thisConsumes).lower;
    if ((*(uint *)&pNVar4->field_0xc & 2) == 0) {
      if (CVar3 != 0) {
        if ((*(uint *)&pNVar4->field_0xc & 1) == 0) goto LAB_00e9a7e0;
        if ((pNVar4->thisConsumes).upper != 1 || CVar3 != 1) {
          bVar10 = false;
        }
        goto LAB_00e9a7e2;
      }
      goto LAB_00e9ac7e;
    }
    if ((pNVar4->thisConsumes).upper != 0 || CVar3 != 0) {
      if (CVar3 != 0) goto LAB_00e9a7e0;
      goto LAB_00e9ac7e;
    }
    ppAVar2 = &pAVar18->tail;
    bVar8 = true;
    pAVar18 = *ppAVar2;
  } while (*ppAVar2 != (AltNode *)0x0);
LAB_00e9a904:
  if (iVar19 == 0) {
    CVar17 = None;
LAB_00e9a942:
    this->scheme = CVar17;
    this->isOptional = true;
    return;
  }
  if ((((this->super_Node).field_0xc & 4) != 0) && (bVar10)) {
    pCVar15 = (this->super_Node).firstSet;
    pCVar5 = (pCVar15->rep).full.root;
    if (&DAT_00000004 < (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7)) {
      if (pCVar5 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
      }
      else {
        if ((pCVar5 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00e9adf3;
          *puVar16 = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
        pCVar5 = (pCVar15->rep).full.root;
        if (pCVar5 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2);
        }
        uVar11 = iVar14 + uVar11;
      }
    }
    else {
      uVar11 = (int)pCVar5 - 1;
    }
    CVar17 = Set;
    if (uVar22 == uVar11) goto LAB_00e9a942;
  }
  if ((this->super_Node).followConsumes.lower != 0) {
    CharSet<char16_t>::CharSet((CharSet<char16_t> *)local_90);
    uVar7 = unionSet.rep._32_8_;
    CharSet<char16_t>::UnionInPlace
              ((CharSet<char16_t> *)local_90,*(ArenaAllocator **)(unionSet.rep._32_8_ + 8),
               (this->super_Node).firstSet);
    CharSet<char16_t>::UnionInPlace
              ((CharSet<char16_t> *)local_90,*(ArenaAllocator **)(uVar7 + 8),
               (this->super_Node).followSet);
    pCVar15 = (this->super_Node).followSet;
    pCVar5 = (pCVar15->rep).full.root;
    if (&DAT_00000004 < (undefined1 *)((long)&pCVar5[-1]._vptr_CharSetNode + 7)) {
      if (pCVar5 == (CharSetNode *)0x0) {
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
      }
      else {
        if ((pCVar5 != (CharSetNode *)&CharSetFull::Instance) &&
           (uVar13 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00e9adf3;
          *puVar16 = 0;
        }
        uVar11 = CharBitvec::Count(&(pCVar15->rep).full.direct);
        pCVar5 = (pCVar15->rep).full.root;
        if (pCVar5 == (CharSetNode *)&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*pCVar5->_vptr_CharSetNode[0xb])(pCVar5,2);
        }
        uVar11 = iVar14 + uVar11;
      }
    }
    else {
      uVar11 = (int)pCVar5 - 1;
    }
    if (&DAT_00000004 < (undefined1 *)((long)local_90 - 1U)) {
      if (local_90 == (undefined1  [8])0x0) {
        uVar12 = CharBitvec::Count((CharBitvec *)&unionSet);
      }
      else {
        if ((local_90 != (undefined1  [8])&CharSetFull::Instance) &&
           (uVar13 = (*(*(_func_int ***)local_90)[0xb])(local_90,2), 0xff00 < uVar13)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar16 = 1;
          bVar8 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                             ,0x252,
                             "(rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00)"
                             ,
                             "rep.full.root == CharSetFull::TheFullNode || rep.full.root->Count(CharSetNode::levels - 1) <= 0xFF00"
                            );
          if (!bVar8) goto LAB_00e9adf3;
          *puVar16 = 0;
        }
        uVar12 = CharBitvec::Count((CharBitvec *)&unionSet);
        if (local_90 == (undefined1  [8])&CharSetFull::Instance) {
          iVar14 = 0xff00;
        }
        else {
          iVar14 = (*(*(_func_int ***)local_90)[0xb])(local_90,2);
        }
        uVar12 = iVar14 + uVar12;
      }
    }
    else {
      uVar12 = local_90._0_4_ - 1;
    }
    if (uVar11 + uVar22 == uVar12) {
      CVar17 = Set;
      if (((!bVar10) && (CVar17 = Chain, (bool)(1 < iVar19 & bVar20))) && (uVar22 < 0x19)) {
        this->switchSize = uVar22;
        CVar17 = Switch;
      }
      goto LAB_00e9a942;
    }
  }
LAB_00e9ac7e:
  do {
    local_90._0_4_ = 1;
    iVar19 = (*pAVar21->head->_vptr_Node[0x14])(pAVar21->head,unionSet.rep._32_8_);
    uVar7 = unionSet.rep._32_8_;
    if (((char)iVar19 == '\0') || (0x10 < (uint)local_90._0_4_)) goto LAB_00e9ad88;
    ppAVar2 = &pAVar21->tail;
    pAVar21 = *ppAVar2;
  } while (*ppAVar2 != (AltNode *)0x0);
  if ((uint)local_90._0_4_ < 0x11) {
    local_90 = (undefined1  [8])0x0;
    unionSet.rep.compact.countPlusOne._0_1_ = 0;
    unionSet.rep._4_8_ = 0;
    pAVar18 = this;
    do {
      iVar19 = (*pAVar18->head->_vptr_Node[0x15])
                         (pAVar18->head,uVar7,local_90,0,
                          (ulong)((*(uint *)&(this->super_Node).field_0xc & 4) >> 2));
      if ((char)iVar19 == '\0') goto LAB_00e9ad88;
      pAVar18 = pAVar18->tail;
    } while (pAVar18 != (AltNode *)0x0);
    bVar10 = CharTrie::IsDepthZero((CharTrie *)local_90);
    if (bVar10) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar16 = 1;
      bVar10 = Js::Throw::ReportAssert
                         ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                          ,0x9e1,"(!trie.IsDepthZero())","!trie.IsDepthZero()");
      if (!bVar10) {
LAB_00e9adf3:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar16 = 0;
    }
    bVar10 = CharTrie::IsDepthOne((CharTrie *)local_90);
    if (bVar10) {
      this->isOptional = false;
      CVar17 = Set;
    }
    else {
      this_00 = (RuntimeCharTrie *)
                new<Memory::ArenaAllocator>(0x10,*(ArenaAllocator **)(uVar7 + 8),0x364470);
      this_00->count = 0;
      this_00->children = (RuntimeCharTrieEntry *)0x0;
      this->runtimeTrie = this_00;
      RuntimeCharTrie::CloneFrom
                (this_00,*(ScriptContext **)uVar7,*(ArenaAllocator **)(uVar7 + 0x10),
                 (CharTrie *)local_90);
      CVar17 = Trie;
    }
    this->scheme = CVar17;
  }
  else {
LAB_00e9ad88:
    this->scheme = Try;
    puVar1 = &(this->super_Node).field_0xd;
    *puVar1 = *puVar1 & 0xfd;
  }
  return;
code_r0x00e9a3cd:
  pAVar18 = pAVar21;
  if (pAVar21 == (AltNode *)0x0) goto LAB_00e9a494;
  goto LAB_00e9a3bf;
}

Assistant:

void AltNode::AnnotatePass4(Compiler& compiler)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        //
        // Simplification rule
        //
        // If the follow is irrefutable then we can ignore all items after an irrefutable item, since
        // we'll never be able to backtrack into them.
        // E.g.: (a*|b*)c* === a*c*
        //

        bool simplified = false;
        if (isFollowIrrefutable && isThisIrrefutable)
        {
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->isThisIrrefutable && curr->tail != 0)
                {
                    curr->tail = 0;
                    simplified = true;
                    break;
                }
            }
        }

        if (simplified)
        {
            Assert(!isFirstExact);
            // Recalculate firstSet. Since it can only get smaller, and alternative could not have had an exact
            // first set, this recalculation does not make any decisions already made based on the current firstSet
            // unsound.
            // NOTE: Is it worth recalculating the WillNotProgress/WillNotRegress bools?
            firstSet = Anew(compiler.ctAllocator, UnicodeCharSet);
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
                firstSet->UnionInPlace(compiler.ctAllocator, *curr->head->firstSet);
        }

        //
        // Annotate items
        //
        isDeterministic = true;
        for (AltNode* curr = this; curr != 0; curr = curr->tail)
        {
            curr->head->AnnotatePass4(compiler);
            if (!curr->head->isDeterministic)
                isDeterministic = false;
        }

        //
        // Compilation scheme: Switch/Chain/Set, not isOptional
        //
        // If no item can match empty and all items' FIRST sets are pairwise disjoint then we can
        // commit to an item using a 1 char lookahead. We can fall-through to the last
        // item without guarding it since it will fail if the next character cannot match.
        // E.g.: (abc|def)
        //

        {
            // Pass 1: Items cannot match empty, accumulate counts
            bool fires = true;
            bool allCompact = true;
            bool allSimpleOneChar = true;
            int numItems = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                numItems++;
                if (!curr->head->firstSet->IsCompact())
                {
                    allCompact = false;
                }
                if (!curr->head->IsSimpleOneChar())
                {
                    allSimpleOneChar = false;
                }
                totalChars += curr->head->firstSet->Count();
            }

            if (fires)
            {
                // To go from two to one items requires the first item
                // to be irrefutable, in which case it could match empty and this rule won't fire.
                Assert(numItems > 1);
                // Step 2: Check FIRST sets are disjoint
                if (totalChars == firstSet->Count())
                {
                    // **COMMIT**
                    if (allSimpleOneChar)
                    {
                        // This will probably never fire since the parser has already converted alts-of-chars/sets
                        // to sets. We include it for symmetry with below.
                        scheme = Set;
                    }
                    else if (allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        // Can use a switch instruction to jump to item
                        scheme = Switch;
                        switchSize = totalChars;
                    }
                    else
                    {
                        // Must use a chain of jump instructions to jump to item
                        scheme = Chain;
                    }
                    isOptional = false;
                    return;
                }
            }
        }

        //
        // Compilation scheme: None/Switch/Chain/Set, isOptional
        //
        // Condition (1):
        // If some items are empty-only, the rest (if any) cannot match empty, follow cannot match empty, and
        // all items' FIRST sets are pairwise disjoint and disjoint from the FOLLOW set, then we can commit to
        // either a non-empty item or to the empty item using a 1 char lookahead. In this case we just emit each
        // non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: (abc||def)h
        //
        // Condition (2):
        // If some items are empty-only, the rest (if any) cannot match empty, follow is irrefutable, and all
        // items' FIRST sets are pairwise disjoint, then we can commit to either a non-empty item or to the empty
        // item using a 1 char lookahead, provided each non-empty item obeys the condition:
        //   ** the item can't fail if given an arbitrary input starting with a character in its FIRST set **
        // Currently, we can prove that only for IsSimpleOneChar items, though more analysis could widen the class.
        // Again, we emit each non-empty item with a guard, and fall-through to follow if no guard fires.
        // E.g.: ([abc]|)a*
        //
        // Condition (3):
        // If all items are empty-only, we can commit to a single empty-only item

        {
            // Pass 1
            bool fires = false;
            bool allSimpleOneChar = true;
            bool allCompact = true;
            int numNonEmpty = 0;
            uint totalChars = 0;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                if (curr->head->IsEmptyOnly())
                {
                    fires = true;
                }
                else if (curr->head->thisConsumes.CouldMatchEmpty())
                {
                    fires = false;
                    break;
                }
                else
                {
                    numNonEmpty++;
                    if (!curr->head->IsSimpleOneChar())
                    {
                        allSimpleOneChar = false;
                    }
                    if (!curr->head->firstSet->IsCompact())
                    {
                        allCompact = false;
                    }
                    totalChars += curr->head->firstSet->Count();
                }
            }

            if (fires)
            {
                // The firing condition is not strong enough yet.
                fires = false;
                // Check conditions (2) and (3) first because they're faster, then check condition (1).
                if (numNonEmpty == 0 ||
                    (isFollowIrrefutable && allSimpleOneChar && totalChars == firstSet->Count()))
                {
                    fires = true;
                }
                else if (!followConsumes.CouldMatchEmpty())
                {
                    // Check whether all FIRST sets are pairwise disjoint
                    // and disjoint from the FOLLOW set.
                    CharSet<Char> unionSet;
                    unionSet.UnionInPlace(compiler.ctAllocator, *firstSet);
                    unionSet.UnionInPlace(compiler.ctAllocator, *followSet);
                    if (totalChars + followSet->Count() == unionSet.Count())
                    {
                        fires = true;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    if (numNonEmpty == 0)
                    {
                        scheme = None;
                    }
                    else if (allSimpleOneChar)
                    {
                        scheme = Set;
                    }
                    else if (numNonEmpty > 1 && allCompact && totalChars <= Switch24Inst::MaxCases)
                    {
                        switchSize = totalChars;
                        scheme = Switch;
                    }
                    else
                    {
                        scheme = Chain;
                    }
                    isOptional = true;
                    return;
                }
            }
        }

        //
        // Compilation scheme: Trie
        //
        // If alt is equivalent to the form:
        //   (literal1|...|literaln)
        // (we expand items with embedded character classes such as a[bc]d to (abd|acd)) and either:
        //  - follow is irrefutable and no later literal is a proper prefix of an earlier literal
        //    (and we may ignore later literals which have an earlier literal as proper prefix)
        //    E.g.: (ab|ac|abd)a* === (ab|ac)a*
        // or:
        //  - follow is not irrefutable and no literal is a proper prefix of any other literal
        //    and the branching factor of the resulting trie is smallish
        //    E.g.: (abc|abd|abe)f
        // then we can use a character trie to match the appropriate item.
        //

        {
            // Pass 1: Items must be structurally appropriate and not result in too many alternatives after expansion
            bool fires = true;
            for (AltNode* curr = this; curr != 0; curr = curr->tail)
            {
                uint numAlts = 1;
                if (!curr->head->IsCharTrieArm(compiler, numAlts))
                {
                    fires = false;
                    break;
                }
                if (numAlts > maxTrieArmExpansion)
                {
                    fires = false;
                    break;
                }
            }

            if (fires)
            {
                // Pass 2: Attempt to construct the trie, checking for prefixes.
                CharTrie trie;
                for (AltNode* curr = this; curr != 0; curr = curr->tail)
                {
                    if (!curr->head->BuildCharTrie(compiler, &trie, 0, isFollowIrrefutable))
                    {
                        fires = false;
                        break;
                    }
                }

                if (fires)
                {
                    // **COMMIT**
                    // If follow is irrefutable and first item is empty, the trie would be of depth zero.
                    // However, in this case, the first simplification rule would have replaced the alt with a
                    // single empty item, and the 'None' compilation scheme would have been selected above.
                    //
                    // Similarly, if all alternations are empty and follow is refutable, the trie would be
                    // of depth zero, and the 'None' compilation scheme would have been selected above.
                    Assert(!trie.IsDepthZero());
                    if (trie.IsDepthOne())
                    {
                        // This case will fire if follow is irrefutable and all non length one items have an
                        // earlier one-character item as prefix. In this case we don't need the trie: the
                        // firstSet has all the information.
                        isOptional = false;
                        scheme = Set;
                    }
                    else
                    {
                        // Root of trie will live in compile-time allocator, but body will be in run-time allocator
                        runtimeTrie = Anew(compiler.ctAllocator, RuntimeCharTrie);
                        runtimeTrie->CloneFrom(compiler.scriptContext, compiler.rtAllocator, trie);
                        scheme = Trie;
                    }
                    return;
                }
            }
        }

        //
        // Compilation scheme: Try
        //

        scheme = Try;
        isDeterministic = false; // NON-DETERMINISTIC
    }